

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall
FxRuntimeStateIndex::Resolve(FxRuntimeStateIndex *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  FxIntCast *this_00;
  undefined4 extraout_var_00;
  PClassActor *pPVar3;
  FxStateByIndex *this_01;
  undefined4 extraout_var_01;
  FxConstant *this_02;
  char *message;
  undefined4 uVar4;
  FCompileContext *size;
  ExpVal local_30;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Index != (FxExpression *)0x0) {
    size = ctx;
    iVar1 = (*this->Index->_vptr_FxExpression[2])();
    pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Index = pFVar2;
    if (pFVar2 != (FxExpression *)0x0) {
      iVar1 = (*(pFVar2->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
      if ((char)iVar1 == '\0') {
        message = "Numeric type expected";
      }
      else {
        iVar1 = (*this->Index->_vptr_FxExpression[3])();
        if ((char)iVar1 == '\0') {
          if (this->Index->ValueType->RegType != '\0') {
            this_00 = (FxIntCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
            FxIntCast::FxIntCast(this_00,this->Index,ctx->FromDecorate,false);
            this->Index = (FxExpression *)this_00;
            iVar1 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
            this->Index = (FxExpression *)CONCAT44(extraout_var_00,iVar1);
            if ((FxExpression *)CONCAT44(extraout_var_00,iVar1) == (FxExpression *)0x0)
            goto LAB_0051a9f3;
          }
          pPVar3 = dyn_cast<PClassActor>((DObject *)ctx->Class);
          if ((pPVar3 != (PClassActor *)0x0) && (0 < pPVar3->NumOwnedStates)) {
            iVar1 = FStateLabelStorage::AddPointer
                              (&StateLabels,pPVar3->OwnedStates + ctx->StateIndex);
            this->symlabel = iVar1;
            (this->super_FxExpression).ValueType = (PType *)TypeStateLabel;
            return &this->super_FxExpression;
          }
          __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x2640,
                        "virtual FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &)");
        }
        pFVar2 = this->Index + 1;
        ExpVal::ExpVal(&local_30,(ExpVal *)pFVar2);
        if ((local_30.Type)->RegType == '\x01') {
          uVar4 = (undefined4)(double)CONCAT44(local_30.field_1._4_4_,local_30.field_1.Int);
        }
        else {
          uVar4 = 0;
          if ((local_30.Type)->RegType == '\0') {
            uVar4 = local_30.field_1.Int;
          }
        }
        ExpVal::~ExpVal(&local_30);
        if (-1 < (int)uVar4) {
          if (uVar4 != 0) {
            this_01 = (FxStateByIndex *)
                      FxExpression::operator_new((FxExpression *)0x30,(size_t)pFVar2);
            FxStateByIndex::FxStateByIndex
                      (this_01,uVar4 + ctx->StateIndex,&(this->super_FxExpression).ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            iVar1 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
            return (FxExpression *)CONCAT44(extraout_var_01,iVar1);
          }
          if (ctx->FromDecorate != false) {
            this_02 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar2);
            FxConstant::FxConstant(this_02,0,&(this->super_FxExpression).ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            (this_02->super_FxExpression).ValueType = (PType *)TypeStateLabel;
            return &this_02->super_FxExpression;
          }
        }
        message = "State index must be positive";
      }
      FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
    }
  }
LAB_0051a9f3:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Index, ctx);

	if (!Index->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (Index->isConstant())
	{
		int index = static_cast<FxConstant *>(Index)->GetValue().GetInt();
		if (index < 0 || (index == 0 && !ctx.FromDecorate))
		{
			ScriptPosition.Message(MSG_ERROR, "State index must be positive");
			delete this;
			return nullptr;
		}
		else if (index == 0)
		{
			int symlabel = StateLabels.AddPointer(nullptr);
			auto x = new FxConstant(symlabel, ScriptPosition);
			delete this;
			x->ValueType = TypeStateLabel;
			return x;
		}
		else
		{
			auto x = new FxStateByIndex(ctx.StateIndex + index, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}
	else if (Index->ValueType->GetRegType() != REGT_INT)
	{ // Float.
		Index = new FxIntCast(Index, ctx.FromDecorate);
		SAFE_RESOLVE(Index, ctx);
	}
	auto aclass = dyn_cast<PClassActor>(ctx.Class);
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);
	symlabel = StateLabels.AddPointer(aclass->OwnedStates + ctx.StateIndex);
	ValueType = TypeStateLabel;
	return this;
}